

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O2

size_t __thiscall Memory::Recycler::RootMark(Recycler *this,CollectionState markState)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  size_t sVar5;
  size_t sVar6;
  undefined8 *in_FS_OFFSET;
  Recycler *local_40;
  RecyclerScanMemoryCallback scanMemory;
  BOOL stacksScannedByRuntime;
  AutoFilterExceptionRegion __autoFilterExceptionRegion;
  
  if ((markState != CollectionStateRescanMark) && (this->needOOMRescan != false)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0xa82,"(!this->NeedOOMRescan() || markState == CollectionStateRescanMark)",
                       "!this->NeedOOMRescan() || markState == CollectionStateRescanMark");
    if (!bVar3) goto LAB_002886e8;
    *puVar1 = 0;
  }
  if (this->recyclerFlagsTable->Verbose == true) {
    bVar3 = Js::Phases::IsEnabled(&this->recyclerFlagsTable->Trace,RecyclerPhase);
    if (bVar3) {
      Output::Print(L"PreMark done, partial collect: %d\n",(ulong)this->inPartialCollectMode);
    }
  }
  if ((this->collectionState).value !=
      ((uint)(markState != CollectionStateMark) << 6 | CollectionStateFindRoots)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0xa89,
                       "(collectionState == (markState == CollectionStateMark? CollectionStateFindRoots : CollectionStateRescanFindRoots))"
                       ,
                       "collectionState == (markState == CollectionStateMark? CollectionStateFindRoots : CollectionStateRescanFindRoots)"
                      );
    if (!bVar3) {
LAB_002886e8:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar1 = 0;
  }
  scanMemory.recycler._0_4_ = 0;
  AutoFilterExceptionRegion::AutoFilterExceptionRegion
            ((AutoFilterExceptionRegion *)((long)&scanMemory.recycler + 4),ExceptionType_All);
  local_40 = this;
  iVar4 = (*this->collectionWrapper->_vptr_RecyclerCollectionWrapper[3])
                    (this->collectionWrapper,&local_40,&scanMemory);
  AutoFilterExceptionRegion::~AutoFilterExceptionRegion
            ((AutoFilterExceptionRegion *)((long)&scanMemory.recycler + 4));
  sVar5 = FindRoots(this);
  sVar5 = sVar5 + CONCAT44(extraout_var,iVar4);
  if ((int)scanMemory.recycler == 0) {
    sVar6 = ScanStack(this);
    sVar5 = sVar5 + sVar6;
  }
  ObservableValue<Memory::CollectionState>::SetValue(&this->collectionState,markState);
  if (this->enableParallelMark == true) {
    DoParallelMark(this);
  }
  else {
    ProcessMark(this,false);
  }
  bVar3 = EndMark(this);
  if (bVar3) {
    sVar5 = 0x500001;
  }
  return sVar5;
}

Assistant:

size_t
Recycler::RootMark(CollectionState markState)
{
    size_t scannedRootBytes = 0;
    Assert(!this->NeedOOMRescan() || markState == CollectionStateRescanMark);
#if ENABLE_PARTIAL_GC
    RecyclerVerboseTrace(GetRecyclerFlagsTable(), _u("PreMark done, partial collect: %d\n"), this->inPartialCollectMode);
#else
    RecyclerVerboseTrace(GetRecyclerFlagsTable(), _u("PreMark done, partial collect not available\n"));
#endif

    Assert(collectionState == (markState == CollectionStateMark? CollectionStateFindRoots : CollectionStateRescanFindRoots));

    BOOL stacksScannedByRuntime = FALSE;
    {
        // We are about to scan roots in thread, notify the runtime first so it can stop threads if necessary and also provide additional roots
        AUTO_NO_EXCEPTION_REGION;
        RecyclerScanMemoryCallback scanMemory(this);
        scannedRootBytes += collectionWrapper->RootMarkCallback(scanMemory, &stacksScannedByRuntime);
    }

    scannedRootBytes += FindRoots();

    if (!stacksScannedByRuntime)
    {
        // The runtime did not scan the stack(s) for us, so we use the normal Recycler code.
        scannedRootBytes += ScanStack();
    }

    this->SetCollectionState(markState);

#if ENABLE_CONCURRENT_GC
    if (this->enableParallelMark)
    {
        this->DoParallelMark();
    }
    else
#endif
    {
        this->ProcessMark(false);
    }

    if (this->EndMark())
    {
        // REVIEW: This heuristic doesn't apply when partial is off so there's no need
        // to modify scannedRootBytes here, correct?
#if ENABLE_PARTIAL_GC
        // return large root scanned byte to not get into partial mode if we are low on memory
        scannedRootBytes = RecyclerSweepManager::MaxPartialCollectRescanRootBytes + 1;
#endif
    }

    return scannedRootBytes;
}